

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Reference>
          (AsciiParser *this,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Reference *pRVar5;
  Reference *pRVar6;
  bool bVar7;
  byte unaff_BPL;
  char c;
  bool triple_deliminated;
  char ce;
  char local_182;
  bool local_181;
  Reference local_180;
  
  bVar7 = SkipWhitespace(this);
  if (bVar7) {
    bVar7 = Char1(this,&local_182);
    if (bVar7) {
      if (local_182 != '[') {
        Rewind(this,1);
        local_180.asset_path.asset_path_._M_dataplus._M_p =
             (pointer)&local_180.asset_path.asset_path_.field_2;
        local_180.asset_path.asset_path_._M_string_length = 0;
        local_180.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
        local_180.asset_path.resolved_path_._M_dataplus._M_p =
             (pointer)&local_180.asset_path.resolved_path_.field_2;
        local_180.asset_path.resolved_path_._M_string_length = 0;
        local_180.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
        local_180.prim_path._prim_part._M_dataplus._M_p =
             (pointer)&local_180.prim_path._prim_part.field_2;
        local_180.prim_path._prim_part._M_string_length = 0;
        local_180.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
        local_180.prim_path._prop_part._M_dataplus._M_p =
             (pointer)&local_180.prim_path._prop_part.field_2;
        local_180.prim_path._prop_part._M_string_length = 0;
        local_180.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
        paVar1 = &local_180.prim_path._variant_part.field_2;
        local_180.prim_path._variant_part._M_string_length = 0;
        local_180.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_180.prim_path._variant_selection_part.field_2;
        local_180.prim_path._variant_selection_part._M_string_length = 0;
        local_180.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
        paVar3 = &local_180.prim_path._variant_part_str.field_2;
        local_180.prim_path._variant_part_str._M_string_length = 0;
        local_180.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
        paVar4 = &local_180.prim_path._element.field_2;
        local_180.prim_path._element._M_string_length = 0;
        local_180.prim_path._element.field_2._M_local_buf[0] = '\0';
        local_180.prim_path._path_type.has_value_ = false;
        local_180.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_180.prim_path._valid = false;
        local_180.layerOffset._offset = 0.0;
        local_180.layerOffset._scale = 1.0;
        local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header;
        local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        local_180.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_181 = false;
        local_180.prim_path._variant_part._M_dataplus._M_p = (pointer)paVar1;
        local_180.prim_path._variant_selection_part._M_dataplus._M_p = (pointer)paVar2;
        local_180.prim_path._variant_part_str._M_dataplus._M_p = (pointer)paVar3;
        local_180.prim_path._element._M_dataplus._M_p = (pointer)paVar4;
        local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = ParseReference(this,&local_180,&local_181);
        if (!bVar7) {
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::_M_erase(&local_180.customData._M_t,
                     (_Link_type)
                     local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._element._M_dataplus._M_p != paVar4) {
            operator_delete(local_180.prim_path._element._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._element.field_2._M_allocated_capacity.
                                     _1_7_,local_180.prim_path._element.field_2._M_local_buf[0]) + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
            operator_delete(local_180.prim_path._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._variant_part_str.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_180.prim_path._variant_part_str.field_2._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_180.prim_path._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._variant_selection_part.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_180.prim_path._variant_selection_part.field_2.
                                     _M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._variant_part._M_dataplus._M_p != paVar1) {
            operator_delete(local_180.prim_path._variant_part._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._variant_part.field_2._M_allocated_capacity
                                     ._1_7_,local_180.prim_path._variant_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._prop_part._M_dataplus._M_p !=
              &local_180.prim_path._prop_part.field_2) {
            operator_delete(local_180.prim_path._prop_part._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._prop_part.field_2._M_allocated_capacity.
                                     _1_7_,local_180.prim_path._prop_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.prim_path._prim_part._M_dataplus._M_p !=
              &local_180.prim_path._prim_part.field_2) {
            operator_delete(local_180.prim_path._prim_part._M_dataplus._M_p,
                            CONCAT71(local_180.prim_path._prim_part.field_2._M_allocated_capacity.
                                     _1_7_,local_180.prim_path._prim_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.asset_path.resolved_path_._M_dataplus._M_p !=
              &local_180.asset_path.resolved_path_.field_2) {
            operator_delete(local_180.asset_path.resolved_path_._M_dataplus._M_p,
                            CONCAT71(local_180.asset_path.resolved_path_.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_180.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.asset_path.asset_path_._M_dataplus._M_p !=
              &local_180.asset_path.asset_path_.field_2) {
            operator_delete(local_180.asset_path.asset_path_._M_dataplus._M_p,
                            CONCAT71(local_180.asset_path.asset_path_.field_2._M_allocated_capacity.
                                     _1_7_,local_180.asset_path.asset_path_.field_2._M_local_buf[0])
                            + 1);
          }
          goto LAB_003c662a;
        }
        pRVar5 = (result->
                 super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pRVar6 = (result->
                 super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pRVar6 != pRVar5) {
          ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar5,pRVar6);
          (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
          _M_impl.super__Vector_impl_data._M_finish = pRVar5;
        }
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                  (result,&local_180);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase(&local_180.customData._M_t,
                   (_Link_type)
                   local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._element._M_dataplus._M_p != paVar4) {
          operator_delete(local_180.prim_path._element._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._element.field_2._M_allocated_capacity._1_7_,
                                   local_180.prim_path._element.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
          operator_delete(local_180.prim_path._variant_part_str._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._variant_part_str.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_180.prim_path._variant_part_str.field_2._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_180.prim_path._variant_selection_part._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._variant_selection_part.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_180.prim_path._variant_selection_part.field_2._M_local_buf
                                   [0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._variant_part._M_dataplus._M_p != paVar1) {
          operator_delete(local_180.prim_path._variant_part._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._variant_part.field_2._M_allocated_capacity.
                                   _1_7_,local_180.prim_path._variant_part.field_2._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._prop_part._M_dataplus._M_p !=
            &local_180.prim_path._prop_part.field_2) {
          operator_delete(local_180.prim_path._prop_part._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._prop_part.field_2._M_allocated_capacity.
                                   _1_7_,local_180.prim_path._prop_part.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.prim_path._prim_part._M_dataplus._M_p !=
            &local_180.prim_path._prim_part.field_2) {
          operator_delete(local_180.prim_path._prim_part._M_dataplus._M_p,
                          CONCAT71(local_180.prim_path._prim_part.field_2._M_allocated_capacity.
                                   _1_7_,local_180.prim_path._prim_part.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.asset_path.resolved_path_._M_dataplus._M_p !=
            &local_180.asset_path.resolved_path_.field_2) {
          operator_delete(local_180.asset_path.resolved_path_._M_dataplus._M_p,
                          CONCAT71(local_180.asset_path.resolved_path_.field_2._M_allocated_capacity
                                   ._1_7_,local_180.asset_path.resolved_path_.field_2._M_local_buf
                                          [0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.asset_path.asset_path_._M_dataplus._M_p !=
            &local_180.asset_path.asset_path_.field_2) {
          operator_delete(local_180.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_180.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_180.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
LAB_003c64d4:
        unaff_BPL = 1;
        goto LAB_003c662c;
      }
      bVar7 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar7) goto LAB_003c662a;
      bVar7 = Char1(this,(char *)&local_180);
      if (bVar7) {
        if ((char)local_180.asset_path.asset_path_._M_dataplus._M_p == ']') {
          pRVar5 = (result->
                   super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pRVar6 = (result->
                   super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          unaff_BPL = 1;
          if (pRVar6 != pRVar5) {
            ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(pRVar5,pRVar6);
            (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_finish = pRVar5;
          }
          goto LAB_003c65d4;
        }
        Rewind(this,1);
        bVar7 = true;
      }
      else {
        unaff_BPL = 0;
LAB_003c65d4:
        bVar7 = false;
      }
      if (!bVar7) goto LAB_003c662c;
      bVar7 = SepBy1BasicType<tinyusdz::Reference>(this,',',']',result);
      if (bVar7) {
        bVar7 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (bVar7) {
          bVar7 = Expect(this,']');
          if (bVar7) goto LAB_003c64d4;
        }
      }
    }
  }
LAB_003c662a:
  unaff_BPL = 0;
LAB_003c662c:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Reference> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    // Guess non-list version
    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(ref);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }


    if (!SepBy1BasicType<Reference>(',', ']', result)) {
      return false;
    }
    DCOUT("parsed ref array");

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }

  }

  return true;
}